

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

int __thiscall stream::slice_reader::open(slice_reader *this,char *__file,int __oflag,...)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  int extraout_EAX;
  int iVar6;
  int extraout_EAX_00;
  int extraout_EAX_01;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  ostream *os;
  string *psVar8;
  path_type slice_file2;
  path_type slice_file;
  path p_1;
  ostringstream oss;
  path local_228;
  path local_208;
  path local_1e8 [2];
  undefined1 local_1a8 [376];
  
  this->current_slice = (size_t)__file;
  this->is = (istream *)&this->ifs;
  std::ifstream::close();
  slice_filename((string *)local_1a8,&this->base_file,(size_t)__file,this->slices_per_disk);
  paVar1 = &local_208.m_pathname.field_2;
  local_208.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_1a8._0_8_,(pointer)(local_1a8._0_8_ + local_1a8._8_8_));
  pcVar4 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar4) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar3 = (this->dir).m_pathname._M_dataplus._M_p;
  local_1a8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar3,pcVar3 + (this->dir).m_pathname._M_string_length);
  boost::filesystem::path::operator/=((path *)local_1a8,&local_208);
  bVar5 = open_file(this,(path_type *)local_1a8);
  iVar6 = (int)CONCAT71(extraout_var,bVar5);
  if ((pointer)local_1a8._0_8_ != pcVar4) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    iVar6 = extraout_EAX;
  }
  if (bVar5) goto LAB_0014f28c;
  slice_filename((string *)local_1a8,&this->base_file2,(size_t)__file,this->slices_per_disk);
  paVar2 = &local_228.m_pathname.field_2;
  local_228.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_1a8._0_8_,(pointer)(local_1a8._0_8_ + local_1a8._8_8_));
  if ((pointer)local_1a8._0_8_ != pcVar4) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((this->base_file2)._M_string_length == 0) {
LAB_0014f20c:
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    bVar5 = false;
  }
  else {
    iVar6 = boost::filesystem::path::compare(&local_228);
    if (iVar6 == 0) goto LAB_0014f20c;
    local_1e8[0].m_pathname._M_dataplus._M_p = (pointer)&local_1e8[0].m_pathname.field_2;
    pcVar4 = (this->dir).m_pathname._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e8,pcVar4,pcVar4 + (this->dir).m_pathname._M_string_length);
    boost::filesystem::path::operator/=(local_1e8,&local_228);
    bVar5 = open_file(this,local_1e8);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT71(extraout_var_00,1);
  }
  if ((char)paVar7 != '\0') {
    paVar7 = &local_1e8[0].m_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8[0].m_pathname._M_dataplus._M_p != paVar7) {
      operator_delete(local_1e8[0].m_pathname._M_dataplus._M_p,
                      local_1e8[0].m_pathname.field_2._M_allocated_capacity + 1);
      paVar7 = extraout_RAX;
    }
  }
  iVar6 = (int)paVar7;
  if (bVar5 == false) {
    bVar5 = open_file_case_insensitive(this,&this->dir,&local_208);
    iVar6 = (int)CONCAT71(extraout_var_01,bVar5);
    if (!bVar5) {
      if ((this->base_file2)._M_string_length == 0) {
LAB_0014f2b5:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"could not open slice ",0x15);
        os = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(os,": ",2);
        boost::filesystem::operator<<(os,&local_208);
        if ((this->base_file2)._M_string_length != 0) {
          iVar6 = boost::filesystem::path::compare(&local_228);
          if (iVar6 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," or ",4);
            boost::filesystem::operator<<
                      ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&local_228);
          }
        }
        psVar8 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        std::ios_base::failure[abi:cxx11]::failure(psVar8);
        *(undefined ***)psVar8 = &PTR__failure_00173740;
        __cxa_throw(psVar8,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      iVar6 = boost::filesystem::path::compare(&local_228);
      if (iVar6 == 0) goto LAB_0014f2b5;
      bVar5 = open_file_case_insensitive(this,&this->dir,&local_228);
      iVar6 = (int)CONCAT71(extraout_var_02,bVar5);
      if (!bVar5) goto LAB_0014f2b5;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_228.m_pathname._M_dataplus._M_p,
                    local_228.m_pathname.field_2._M_allocated_capacity + 1);
    iVar6 = extraout_EAX_00;
  }
LAB_0014f28c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_208.m_pathname._M_dataplus._M_p,
                    local_208.m_pathname.field_2._M_allocated_capacity + 1);
    iVar6 = extraout_EAX_01;
  }
  return iVar6;
}

Assistant:

void slice_reader::open(size_t slice) {
	
	current_slice = slice;
	is = &ifs;
	ifs.close();
	
	path_type slice_file = slice_filename(base_file, slice, slices_per_disk);
	if(open_file(dir / slice_file)) {
		return;
	}
	
	path_type slice_file2 = slice_filename(base_file2, slice, slices_per_disk);
	if(!base_file2.empty() && slice_file2 != slice_file && open_file(dir / slice_file2)) {
		return;
	}
	
	if(open_file_case_insensitive(dir, slice_file)) {
		return;
	}
	
	if(!base_file2.empty() && slice_file2 != slice_file && open_file_case_insensitive(dir, slice_file2)) {
		return;
	}
	
	std::ostringstream oss;
	oss << "could not open slice " << slice << ": " << slice_file;
	if(!base_file2.empty() && slice_file2 != slice_file) {
		oss << " or " << slice_file2;
	}
	throw slice_error(oss.str());
}